

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall
CVmConsoleLog::CVmConsoleLog
          (CVmConsoleLog *this,CVmNetFile *nf,osfildef *fp,CCharmapToLocal *cmap,int width)

{
  CVmFormatterLog *this_00;
  CVmFormatter *in_RDI;
  CVmFormatterLog *str;
  CCharmapToLocal *in_stack_ffffffffffffffa8;
  CVmFormatterLog *in_stack_ffffffffffffffc0;
  
  CVmConsoleLogBase::CVmConsoleLogBase((CVmConsoleLogBase *)in_RDI);
  ((CVmConsole *)&in_RDI->_vptr_CVmFormatter)->_vptr_CVmConsole =
       (_func_int **)&PTR_delete_obj_00441ec8;
  this_00 = (CVmFormatterLog *)operator_new(0xf060);
  CVmFormatterLog::CVmFormatterLog
            (in_stack_ffffffffffffffc0,(CVmConsole *)this_00,(int)((ulong)in_RDI >> 0x20));
  in_RDI->console_ = (CVmConsole *)this_00;
  CVmFormatterLog::set_log_file(this_00,(CVmNetFile *)in_RDI,(osfildef *)in_stack_ffffffffffffffa8);
  CVmFormatter::set_charmap(in_RDI,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

CVmConsoleLog::CVmConsoleLog(VMG_ CVmNetFile *nf, osfildef *fp,
                             class CCharmapToLocal *cmap, int width)
{
    CVmFormatterLog *str;

    /* create our display stream */
    disp_str_ = str = new CVmFormatterLog(this, width);

    /* set the file */
    str->set_log_file(vmg_ nf, fp);

    /* set the character mapper */
    str->set_charmap(cmap);
}